

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access-control.c
# Opt level: O0

int ndn_ac_trigger_expiration(uint8_t service,uint32_t received_keyid)

{
  int iVar1;
  uint8_t local_589;
  ndn_key_storage_t *pnStack_588;
  uint8_t ac;
  ndn_key_storage_t *storage;
  ndn_interest_t interest;
  ndn_aes_key_t *aes_key;
  int ret;
  uint32_t received_keyid_local;
  uint8_t service_local;
  
  ret._3_1_ = service;
  interest.signature._648_8_ = ndn_ac_get_key_for_service(service);
  if (((ndn_aes_key_t *)interest.signature._648_8_)->key_id < received_keyid) {
    printf("DEBUG: %s, L%d: ","ndn_ac_trigger_expiration",0x246);
    printf("[ACCESSCTL] Local Decryption Key %u forced expired\n",
           (ulong)*(uint *)(interest.signature._648_8_ + 0x24));
    _express_dkey_interest(ret._3_1_);
  }
  else {
    printf("DEBUG: %s, L%d: ","ndn_ac_trigger_expiration",0x24a);
    printf("[ACCESSCTL] Notifying Encryption Key %u forced expired\n",(ulong)received_keyid);
    ndn_interest_init((ndn_interest_t *)&storage);
    pnStack_588 = ndn_key_storage_get_instance();
    iVar1 = ndn_name_append_component((ndn_name_t *)&storage,(name_component_t *)pnStack_588);
    if (iVar1 != 0) {
      return iVar1;
    }
    local_589 = '\x03';
    iVar1 = ndn_name_append_bytes_component((ndn_name_t *)&storage,&local_589,1);
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = ndn_name_append_string_component((ndn_name_t *)&storage,"NOTIFY",6);
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = ndn_name_append_bytes_component((ndn_name_t *)&storage,(uint8_t *)((long)&ret + 3),1);
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = ndn_name_append_keyid((ndn_name_t *)&storage,received_keyid);
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = ndn_forwarder_express_interest_struct
                      ((ndn_interest_t *)&storage,(ndn_on_data_func)0x0,(ndn_on_timeout_func)0x0,
                       (void *)0x0);
    if (iVar1 != 0) {
      return iVar1;
    }
  }
  return 0;
}

Assistant:

int
ndn_ac_trigger_expiration(uint8_t service, uint32_t received_keyid)
{
  int ret = -1;
  // check if it's a local key
  ndn_aes_key_t* aes_key = ndn_ac_get_key_for_service(service);
  if (aes_key->key_id < received_keyid) {
    NDN_LOG_DEBUG("[ACCESSCTL] Local Decryption Key %" PRIu32 " forced expired\n", aes_key->key_id);
    _express_dkey_interest(service);
  }
  else {
    NDN_LOG_DEBUG("[ACCESSCTL] Notifying Encryption Key %" PRIu32 " forced expired\n", received_keyid);
    ndn_interest_t interest;
    ndn_interest_init(&interest);
    ndn_key_storage_t* storage = ndn_key_storage_get_instance();
    ret = ndn_name_append_component(&interest.name, &storage->self_identity[0].components[0]);
    if (ret != 0) return ret;
    uint8_t ac = NDN_SD_AC;
    ret = ndn_name_append_bytes_component(&interest.name, &ac, 1);
    if (ret != 0) return ret;
    ret = ndn_name_append_string_component(&interest.name, "NOTIFY", strlen("NOTIFY"));
    if (ret != 0) return ret;
    ret = ndn_name_append_bytes_component(&interest.name, &service, 1);
    if (ret != 0) return ret;
    ret = ndn_name_append_keyid(&interest.name, received_keyid);
    if (ret != 0) return ret;
    ret = ndn_forwarder_express_interest_struct(&interest, NULL, NULL, NULL);
    if (ret != 0) return ret;
  }

  return NDN_SUCCESS;
}